

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O2

void __thiscall pbrt::RGBFilm::WriteImage(RGBFilm *this,ImageMetadata *metadata,Float splatScale)

{
  Image image;
  Image IStack_128;
  
  GetImage(&IStack_128,this,metadata,splatScale);
  if (LOGGING_LogLevel < 1) {
    Log<std::__cxx11::string&,pbrt::Bounds2<int>&>
              (Verbose,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/film.cpp"
               ,0x21f,"Writing image %s with bounds %s",&(this->super_FilmBase).filename,
               &(this->super_FilmBase).pixelBounds);
  }
  Image::Write(&IStack_128,&(this->super_FilmBase).filename,metadata);
  Image::~Image(&IStack_128);
  return;
}

Assistant:

void RGBFilm::WriteImage(ImageMetadata metadata, Float splatScale) {
    Image image = GetImage(&metadata, splatScale);
    LOG_VERBOSE("Writing image %s with bounds %s", filename, pixelBounds);
    image.Write(filename, metadata);
}